

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::internal::format_decimal<unsigned_long,char,fmt::internal::ThousandsSep>
               (char *buffer,unsigned_long value,uint num_digits,ThousandsSep thousands_sep)

{
  char cVar1;
  byte bVar2;
  char *local_38;
  
  local_38 = buffer + num_digits;
  for (; 99 < value; value = value / 100) {
    cVar1 = BasicData<void>::DIGITS[(value % 100) * 2];
    local_38[-1] = BasicData<void>::DIGITS[(value % 100) * 2 + 1];
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
    local_38[-1] = cVar1;
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
  }
  if (value < 10) {
    bVar2 = (byte)value | 0x30;
  }
  else {
    local_38[-1] = BasicData<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
    bVar2 = BasicData<void>::DIGITS[value * 2 & 0x1fffffffe];
  }
  local_38[-1] = bVar2;
  return;
}

Assistant:

inline void format_decimal(Char *buffer, UInt value, unsigned num_digits, ThousandsSep thousands_sep)
{
    buffer += num_digits;
    while (value >= 100)
    {
        // Integer division is slow so do it for a group of two digits instead
        // of for every digit. The idea comes from the talk by Alexandrescu
        // "Three Optimization Tips for C++". See speed-test for a comparison.
        unsigned index = static_cast<unsigned>((value % 100) * 2);
        value /= 100;
        *--buffer = Data::DIGITS[index + 1];
        thousands_sep(buffer);
        *--buffer = Data::DIGITS[index];
        thousands_sep(buffer);
    }
    if (value < 10)
    {
        *--buffer = static_cast<char>('0' + value);
        return;
    }
    unsigned index = static_cast<unsigned>(value * 2);
    *--buffer = Data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = Data::DIGITS[index];
}